

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  QAM highest_am;
  undefined1 *local_88 [2];
  undefined1 local_78 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_60;
  
  lVar5 = std::_Rb_tree_decrement(&(am->_M_t)._M_impl.super__Rb_tree_header._M_header);
  iVar1 = *(int *)(lVar5 + 0x20);
  iVar2 = *(int *)(lVar5 + 0x24);
  iVar3 = *(int *)(lVar5 + 0x28);
  iVar4 = *(int *)(lVar5 + 0x2c);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,*(long *)(lVar5 + 0x30),
             *(long *)(lVar5 + 0x38) + *(long *)(lVar5 + 0x30));
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
            (&local_60,&am->_M_t);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_60,(uint)(iVar2 <= iVar1),
         iVar3 < iVar4 ^ L);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_60);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am)
{
    QAM highest_am = *(am.rbegin());
	
    // What direction are we going for the bra?
	RRStepType brasteptype = RRStepType::J;  // Moving I->J
	if(highest_am[0] < highest_am[1])
	    brasteptype = RRStepType::I; // Moving J->I

	// What direction are we going for the ket?
	RRStepType ketsteptype = RRStepType::L;  // Moving K->L
	if(highest_am[2] < highest_am[3])
	    ketsteptype = RRStepType::K; // Moving L->K

    Create(am, brasteptype, ketsteptype);
}